

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void algorithm_suite::move_empty(void)

{
  size_type *this;
  undefined4 local_7c;
  size_type local_78 [2];
  basic_moment<double,_(trial::online::with)1> *local_68;
  basic_moment<double,_(trial::online::with)1> *local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  undefined1 local_38 [8];
  moment<double> filter;
  vector<double,_std::allocator<double>_> input;
  
  filter.member.count = 0;
  this = &filter.member.count;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_40._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)this);
  local_48._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)this);
  local_50 = (basic_moment<double,_(trial::online::with)1> *)
             trial::online::
             push_inserter<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>
                       ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_68 = (basic_moment<double,_(trial::online::with)1> *)
             std::
             move<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,trial::online::push_iterator<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>>
                       (local_40,local_48,
                        (push_iterator<trial::online::cumulative::basic_moment<double,_(trial::online::with)1>_>
                         )local_50);
  local_78[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::size
                          ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2e6,"void algorithm_suite::move_empty()",local_78,&local_7c);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&filter.member.count);
  return;
}

Assistant:

void move_empty()
{
    std::vector<double> input = {};
    cumulative::moment<double> filter;
    std::move(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 0);
}